

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

char * __thiscall
Json::DefaultValueAllocator::duplicateStringValue
          (DefaultValueAllocator *this,char *value,uint length)

{
  size_t sVar1;
  char *__dest;
  
  if (length == 0xffffffff) {
    sVar1 = strlen(value);
    length = (uint)sVar1;
  }
  __dest = (char *)malloc((ulong)(length + 1));
  memcpy(__dest,value,(ulong)length);
  __dest[length] = '\0';
  return __dest;
}

Assistant:

virtual char* duplicateStringValue ( const char* value,
                                         unsigned int length = unknown )
    {
        //@todo invesgate this old optimization
        //if ( !value  ||  value[0] == 0 )
        //   return 0;

        if ( length == unknown )
            length = (unsigned int)strlen (value);

        char* newString = static_cast<char*> ( malloc ( length + 1 ) );
        memcpy ( newString, value, length );
        newString[length] = 0;
        return newString;
    }